

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tutorial.cpp
# Opt level: O3

void __thiscall
embree::TutorialApplication::resize(TutorialApplication *this,uint width,uint height)

{
  uint *puVar1;
  
  puVar1 = this->pixels;
  if (puVar1 == (uint *)0x0 || (this->height != height || this->width != width)) {
    this->width = width;
    this->height = height;
    if (puVar1 != (uint *)0x0) {
      alignedUSMFree(puVar1);
    }
    puVar1 = (uint *)alignedUSMMalloc((ulong)(height * width) << 2,0x40,DEFAULT);
    this->pixels = puVar1;
  }
  return;
}

Assistant:

void TutorialApplication::resize(unsigned width, unsigned height)
  {
    if (width == this->width && height == this->height && pixels)
      return;

    this->width = width;
    this->height = height;
      
    if (pixels) alignedUSMFree(pixels);
    pixels = (unsigned*) alignedUSMMalloc(width*height*sizeof(unsigned),64,EmbreeUSMMode::DEVICE_READ_WRITE);
  }